

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O3

int lws_bind_protocol(lws *wsi,lws_protocols *p,char *reason)

{
  lws_protocols *plVar1;
  lws_vhost *plVar2;
  char *__s1;
  int iVar3;
  int iVar4;
  ulong uVar5;
  lws_protocols *plVar6;
  int n;
  
  plVar1 = (wsi->a).protocol;
  plVar6 = ((wsi->a).vhost)->protocols;
  uVar5 = *(ulong *)&wsi->field_0x46e;
  if ((uVar5 >> 0x22 & 1) != 0 && plVar1 != (lws_protocols *)0x0) {
    (*plVar1->callback)(wsi,(lws_callback_reasons)
                            wsi->role_ops->protocol_unbind_cb[(wsi->wsistate >> 0x1d & 1) != 0],
                        wsi->user_space,reason,0);
    uVar5 = *(ulong *)&wsi->field_0x46e & 0xfffffffbffffffff;
    *(ulong *)&wsi->field_0x46e = uVar5;
  }
  if (((uint)uVar5 >> 0xb & 1) == 0) {
    lws_realloc(wsi->user_space,0,"free");
    wsi->user_space = (void *)0x0;
  }
  lws_same_vh_protocol_remove(wsi);
  (wsi->a).protocol = p;
  if (p != (lws_protocols *)0x0) {
    iVar3 = lws_ensure_user_space(wsi);
    if (iVar3 != 0) {
      return 1;
    }
    plVar2 = (wsi->a).vhost;
    iVar3 = plVar2->count_protocols;
    if ((plVar6 < p) && (p < plVar6 + iVar3)) {
      lws_same_vh_protocol_insert(wsi,(int)((ulong)((long)p - (long)plVar6) >> 3) * -0x49249249);
    }
    else {
      if (iVar3 != 0) {
        __s1 = p->name;
        n = 0;
        do {
          if (((__s1 != (char *)0x0) && (plVar6->name != (char *)0x0)) &&
             (iVar4 = strcmp(__s1,plVar6->name), iVar4 == 0)) {
            lws_same_vh_protocol_insert(wsi,n);
            goto LAB_0011927b;
          }
          plVar6 = plVar6 + 1;
          n = n + 1;
        } while (iVar3 != n);
      }
      _lws_log(1,"%s: %p is not in vhost \'%s\' protocols list\n","lws_bind_protocol",p,plVar2->name
              );
    }
LAB_0011927b:
    iVar3 = (*((wsi->a).protocol)->callback)
                      (wsi,(lws_callback_reasons)
                           wsi->role_ops->protocol_bind_cb[(wsi->wsistate >> 0x1d & 1) != 0],
                       wsi->user_space,(void *)0x0,0);
    if (iVar3 != 0) {
      return 1;
    }
    *(ulong *)&wsi->field_0x46e = *(ulong *)&wsi->field_0x46e | 0x400000000;
  }
  return 0;
}

Assistant:

int
lws_bind_protocol(struct lws *wsi, const struct lws_protocols *p,
		  const char *reason)
{
//	if (wsi->a.protocol == p)
//		return 0;
	const struct lws_protocols *vp = wsi->a.vhost->protocols, *vpo;

	if (wsi->a.protocol && wsi->protocol_bind_balance) {
		wsi->a.protocol->callback(wsi,
		       wsi->role_ops->protocol_unbind_cb[!!lwsi_role_server(wsi)],
					wsi->user_space, (void *)reason, 0);
		wsi->protocol_bind_balance = 0;
	}
	if (!wsi->user_space_externally_allocated)
		lws_free_set_NULL(wsi->user_space);

	lws_same_vh_protocol_remove(wsi);

	wsi->a.protocol = p;
	if (!p)
		return 0;

	if (lws_ensure_user_space(wsi))
		return 1;

	if (p > vp && p < &vp[wsi->a.vhost->count_protocols])
		lws_same_vh_protocol_insert(wsi, (int)(p - vp));
	else {
		int n = wsi->a.vhost->count_protocols;
		int hit = 0;

		vpo = vp;

		while (n--) {
			if (p->name && vp->name && !strcmp(p->name, vp->name)) {
				hit = 1;
				lws_same_vh_protocol_insert(wsi, (int)(vp - vpo));
				break;
			}
			vp++;
		}
		if (!hit)
			lwsl_err("%s: %p is not in vhost '%s' protocols list\n",
				 __func__, p, wsi->a.vhost->name);
	}

	if (wsi->a.protocol->callback(wsi, wsi->role_ops->protocol_bind_cb[
				    !!lwsi_role_server(wsi)],
				    wsi->user_space, NULL, 0))
		return 1;

	wsi->protocol_bind_balance = 1;

	return 0;
}